

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void upb::generator::WriteMiniTableSource
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Output *output)

{
  bool bVar1;
  reference pMVar2;
  reference pEVar3;
  reference pFVar4;
  MessageDefPtr message_00;
  EnumDefPtr e_00;
  FieldDefPtr ext_00;
  MessageDefPtr message_01;
  EnumDefPtr e_01;
  FieldDefPtr ext_01;
  FileDefPtr file_00;
  string_view local_4b8;
  string_view local_4a8;
  string_view local_498;
  size_type local_488;
  string_view local_480;
  size_type local_470;
  string_view local_468;
  size_type local_458;
  string_view local_450;
  char *local_440;
  string_view local_438;
  char *local_428;
  string_view local_420;
  char *local_410;
  string_view local_408;
  upb_FileDef *local_3f8;
  string local_3f0;
  string_view local_3d0;
  string_view local_3c0;
  upb_FieldDef *local_3b0;
  string local_3a8;
  string_view local_388;
  upb_FieldDef *local_378;
  FieldDefPtr ext_2;
  iterator __end3_8;
  iterator __begin3_8;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range3_8;
  string_view local_350;
  string_view local_340;
  string_view local_330;
  upb_EnumDef *local_320;
  string local_318;
  string_view local_2f8;
  upb_EnumDef *local_2e8;
  EnumDefPtr e_2;
  iterator __end3_7;
  iterator __begin3_7;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__range3_7;
  string_view local_2c0;
  string_view local_2b0;
  string_view local_2a0;
  upb_MessageDef *local_290;
  string local_288;
  string_view local_268;
  upb_MessageDef *local_258;
  MessageDefPtr message_2;
  iterator __end3_6;
  iterator __begin3_6;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__range3_6;
  string_view local_230;
  upb_FieldDef *local_220;
  upb_FieldDef *local_218;
  FieldDefPtr ext_1;
  iterator __end3_5;
  iterator __begin3_5;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range3_5;
  EnumDefPtr e_1;
  iterator __end3_4;
  iterator __begin3_4;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__range3_4;
  MessageDefPtr message_1;
  iterator __end3_3;
  iterator __begin3_3;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__range3_3;
  string local_1a0;
  string_view local_180;
  upb_FieldDef *local_170;
  FieldDefPtr ext;
  iterator __end3_2;
  iterator __begin3_2;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range3_2;
  string local_148;
  string_view local_128;
  upb_EnumDef *local_118;
  EnumDefPtr e;
  iterator __end3_1;
  iterator __begin3_1;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__range3_1;
  string local_f0;
  string_view local_d0;
  upb_MessageDef *local_c0;
  MessageDefPtr message;
  iterator __end3;
  iterator __begin3;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__range3;
  undefined1 local_98 [8];
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  undefined1 local_68 [8];
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  undefined1 local_48 [8];
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  Output *output_local;
  MiniTableOptions *options_local;
  DefPoolPair *pools_local;
  FileDefPtr file_local;
  
  messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)file.ptr_;
  WriteMiniTableSourceIncludes
            ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)output,output);
  extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)file.ptr_;
  SortedMessages((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48,file);
  SortedExtensions((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68,file);
  SortedEnums((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98,file,
              kClosedEnums);
  if ((options->one_output_per_message & 1U) == 0) {
    __end3_3 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::begin
                         ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                          local_48);
    message_1.ptr_ =
         (upb_MessageDef *)
         std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::end
                   ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_3,
                              (__normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
                               *)&message_1), bVar1) {
      pMVar2 = __gnu_cxx::
               __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
               ::operator*(&__end3_3);
      anon_unknown_3::WriteMessage(pMVar2->ptr_,pools,options,output);
      __gnu_cxx::
      __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
      ::operator++(&__end3_3);
    }
    __end3_4 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    e_1.ptr_ = (upb_EnumDef *)
               std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_4,
                              (__normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                               *)&e_1), bVar1) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
               ::operator*(&__end3_4);
      anon_unknown_3::WriteEnum(pEVar3->ptr_,output);
      __gnu_cxx::
      __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
      ::operator++(&__end3_4);
    }
    __end3_5 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                         ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
    ext_1.ptr_ = (upb_FieldDef *)
                 std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                           ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_5,
                              (__normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                               *)&ext_1), bVar1) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
               ::operator*(&__end3_5);
      local_220 = pFVar4->ptr_;
      local_218 = local_220;
      anon_unknown_3::WriteExtension(pools,(FieldDefPtr)local_220,output);
      __gnu_cxx::
      __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
      ::operator++(&__end3_5);
    }
  }
  else {
    __end3 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::begin
                       ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48)
    ;
    message.ptr_ = (upb_MessageDef *)
                   std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::end
                             ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                              local_48);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
                                       *)&message), bVar1) {
      pMVar2 = __gnu_cxx::
               __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
               ::operator*(&__end3);
      local_c0 = pMVar2->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d0,"extern const upb_MiniTable* $0;\n");
      (anonymous_namespace)::MessagePtrVarName_abi_cxx11_
                (&local_f0,(_anonymous_namespace_ *)local_c0,message_00);
      Output::operator()(output,local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      __gnu_cxx::
      __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    e.ptr_ = (upb_EnumDef *)
             std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                       ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                               *)&e), bVar1) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
               ::operator*(&__end3_1);
      local_118 = pEVar3->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_128,"extern const upb_MiniTableEnum $0;\n");
      (anonymous_namespace)::EnumVarName_abi_cxx11_
                (&local_148,(_anonymous_namespace_ *)local_118,e_00);
      Output::operator()(output,local_128,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      __gnu_cxx::
      __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
      ::operator++(&__end3_1);
    }
    __end3_2 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                         ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
    ext.ptr_ = (upb_FieldDef *)
               std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                         ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                               *)&ext), bVar1) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
               ::operator*(&__end3_2);
      local_170 = pFVar4->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_180,"extern const upb_MiniTableExtension $0;\n");
      (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                (&local_1a0,(_anonymous_namespace_ *)local_170,ext_00);
      Output::operator()(output,local_180,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      __gnu_cxx::
      __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
      ::operator++(&__end3_2);
    }
  }
  bVar1 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::empty
                    ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_230,"static const upb_MiniTable *$0[$1] = {\n");
    __range3_6 = (vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                 std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::size
                           ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                            local_48);
    Output::operator()(output,local_230,(char (*) [16])"messages_layout",
                       (unsigned_long *)&__range3_6);
    __end3_6 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::begin
                         ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                          local_48);
    message_2.ptr_ =
         (upb_MessageDef *)
         std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::end
                   ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_6,
                              (__normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
                               *)&message_2), bVar1) {
      pMVar2 = __gnu_cxx::
               __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
               ::operator*(&__end3_6);
      local_258 = pMVar2->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_268,"  &$0,\n");
      local_290 = local_258;
      (anonymous_namespace)::MessageVarName_abi_cxx11_
                (&local_288,(_anonymous_namespace_ *)local_258,message_01);
      Output::operator()(output,local_268,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      __gnu_cxx::
      __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
      ::operator++(&__end3_6);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"};\n");
    Output::operator()<>(output,local_2a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"\n");
    Output::operator()<>(output,local_2b0);
  }
  bVar1 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::empty
                    ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2c0,"static const upb_MiniTableEnum *$0[$1] = {\n");
    __range3_7 = (vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)
                 std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::size
                           ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    Output::operator()(output,local_2c0,(char (*) [13])"enums_layout",(unsigned_long *)&__range3_7);
    __end3_7 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    e_2.ptr_ = (upb_EnumDef *)
               std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_7,
                              (__normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                               *)&e_2), bVar1) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
               ::operator*(&__end3_7);
      local_2e8 = pEVar3->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2f8,"  &$0,\n");
      local_320 = local_2e8;
      (anonymous_namespace)::EnumVarName_abi_cxx11_
                (&local_318,(_anonymous_namespace_ *)local_2e8,e_01);
      Output::operator()(output,local_2f8,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      __gnu_cxx::
      __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
      ::operator++(&__end3_7);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"};\n");
    Output::operator()<>(output,local_330);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_340,"\n");
    Output::operator()<>(output,local_340);
  }
  bVar1 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::empty
                    ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_350,"\nstatic const upb_MiniTableExtension *$0[$1] = {\n");
    __range3_8 = (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)
                 std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::size
                           ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68)
    ;
    Output::operator()(output,local_350,(char (*) [18])"extensions_layout",
                       (unsigned_long *)&__range3_8);
    __end3_8 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                         ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
    ext_2.ptr_ = (upb_FieldDef *)
                 std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                           ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_8,
                              (__normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                               *)&ext_2), bVar1) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
               ::operator*(&__end3_8);
      local_378 = pFVar4->ptr_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_388,"  &$0,\n");
      local_3b0 = local_378;
      (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                (&local_3a8,(_anonymous_namespace_ *)local_378,ext_01);
      Output::operator()(output,local_388,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      __gnu_cxx::
      __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
      ::operator++(&__end3_8);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c0,"};\n\n");
    Output::operator()<>(output,local_3c0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d0,"const upb_MiniTableFile $0 = {\n");
  local_3f8 = file.ptr_;
  (anonymous_namespace)::FileVarName_abi_cxx11_
            (&local_3f0,(_anonymous_namespace_ *)file.ptr_,file_00);
  Output::operator()(output,local_3d0,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,"  $0,\n");
  bVar1 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::empty
                    ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48);
  local_410 = "messages_layout";
  if (bVar1) {
    local_410 = "NULL";
  }
  Output::operator()(output,local_408,&local_410);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_420,"  $0,\n");
  bVar1 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::empty
                    ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
  local_428 = "enums_layout";
  if (bVar1) {
    local_428 = "NULL";
  }
  Output::operator()(output,local_420,&local_428);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_438,"  $0,\n");
  bVar1 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::empty
                    ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
  local_440 = "extensions_layout";
  if (bVar1) {
    local_440 = "NULL";
  }
  Output::operator()(output,local_438,&local_440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_450,"  $0,\n");
  local_458 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::size
                        ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48
                        );
  Output::operator()(output,local_450,&local_458);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_468,"  $0,\n");
  local_470 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::size
                        ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
  Output::operator()(output,local_468,&local_470);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,"  $0,\n");
  local_488 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::size
                        ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
  Output::operator()(output,local_480,&local_488);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_498,"};\n\n");
  Output::operator()<>(output,local_498);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4a8,"#include \"upb/port/undef.inc\"\n");
  Output::operator()<>(output,local_4a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4b8,"\n");
  Output::operator()<>(output,local_4b8);
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~vector
            ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_98);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~vector
            ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_68);
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~vector
            ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_48);
  return;
}

Assistant:

void WriteMiniTableSource(const DefPoolPair& pools, upb::FileDefPtr file,
                          const MiniTableOptions& options, Output& output) {
  WriteMiniTableSourceIncludes(file, options, output);

  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);

  if (options.one_output_per_message) {
    for (auto message : messages) {
      output("extern const upb_MiniTable* $0;\n", MessagePtrVarName(message));
    }
    for (const auto e : enums) {
      output("extern const upb_MiniTableEnum $0;\n", EnumVarName(e));
    }
    for (const auto ext : extensions) {
      output("extern const upb_MiniTableExtension $0;\n",
             ExtensionVarName(ext));
    }
  } else {
    for (auto message : messages) {
      WriteMessage(message, pools, options, output);
    }
    for (const auto e : enums) {
      WriteEnum(e, output);
    }
    for (const auto ext : extensions) {
      WriteExtension(pools, ext, output);
    }
  }

  // Messages.
  if (!messages.empty()) {
    output("static const upb_MiniTable *$0[$1] = {\n", kMessagesInit,
           messages.size());
    for (auto message : messages) {
      output("  &$0,\n", MessageVarName(message));
    }
    output("};\n");
    output("\n");
  }

  // Enums.
  if (!enums.empty()) {
    output("static const upb_MiniTableEnum *$0[$1] = {\n", kEnumsInit,
           enums.size());
    for (const auto e : enums) {
      output("  &$0,\n", EnumVarName(e));
    }
    output("};\n");
    output("\n");
  }

  if (!extensions.empty()) {
    // Extensions.
    output(
        "\n"
        "static const upb_MiniTableExtension *$0[$1] = {\n",
        kExtensionsInit, extensions.size());

    for (auto ext : extensions) {
      output("  &$0,\n", ExtensionVarName(ext));
    }

    output(
        "};\n"
        "\n");
  }

  output("const upb_MiniTableFile $0 = {\n", FileVarName(file));
  output("  $0,\n", messages.empty() ? "NULL" : kMessagesInit);
  output("  $0,\n", enums.empty() ? "NULL" : kEnumsInit);
  output("  $0,\n", extensions.empty() ? "NULL" : kExtensionsInit);
  output("  $0,\n", messages.size());
  output("  $0,\n", enums.size());
  output("  $0,\n", extensions.size());
  output("};\n\n");

  output("#include \"upb/port/undef.inc\"\n");
  output("\n");
}